

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  Nonnull<char_*> pcVar1;
  size_t in_R9;
  string_view format;
  char local_128 [32];
  long local_108;
  Nonnull<char_*> pcStack_100;
  char local_f8 [32];
  long local_d8;
  Nonnull<char_*> pcStack_d0;
  char local_c8 [32];
  long local_a8;
  Nonnull<char_*> pcStack_a0;
  char local_98 [32];
  long local_78;
  Nonnull<char_*> pcStack_70;
  long local_68;
  Nonnull<char_*> pcStack_60;
  long local_58;
  Nonnull<char_*> pcStack_50;
  long local_48;
  Nonnull<char_*> local_40;
  
  pcVar1 = numbers_internal::FastIntToBuffer(*(int32_t *)(*(long *)this + 0x18),local_98);
  local_a8 = (long)pcVar1 - (long)local_98;
  pcStack_a0 = local_98;
  pcVar1 = numbers_internal::FastIntToBuffer(*(int32_t *)(*(long *)this + 0x1c),local_c8);
  local_d8 = (long)pcVar1 - (long)local_c8;
  pcStack_d0 = local_c8;
  pcVar1 = numbers_internal::FastIntToBuffer(*(int32_t *)(*(long *)(this + 8) + 0x18),local_f8);
  local_108 = (long)pcVar1 - (long)local_f8;
  pcStack_100 = local_f8;
  pcVar1 = numbers_internal::FastIntToBuffer(*(int32_t *)(*(long *)(this + 8) + 0x1c),local_128);
  local_48 = (long)pcVar1 - (long)local_128;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78 = local_a8;
  pcStack_70 = pcStack_a0;
  local_68 = local_d8;
  pcStack_60 = pcStack_d0;
  local_58 = local_108;
  pcStack_50 = pcStack_100;
  format._M_str = (char *)&local_78;
  format._M_len = (size_t)"Reserved range $0 to $1 overlaps with already-defined range $2 to $3.";
  local_40 = local_128;
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x45,format,
             (Nullable<const_absl::string_view_*>)0x4,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}